

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.hpp
# Opt level: O0

uint32_t InstructionSet::x86::
         address<unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                   (Instruction<false> *instruction,DataPointer pointer,Context *context)

{
  Source SVar1;
  unsigned_short *puVar2;
  Context *context_local;
  Instruction<false> *instruction_local;
  DataPointer pointer_local;
  
  instruction_local._2_2_ = pointer;
  SVar1 = DataPointer::source((DataPointer *)((long)&instruction_local + 2));
  switch(SVar1) {
  case C0:
    puVar2 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                       (context);
    instruction_local._4_4_ = (uint32_t)*puVar2;
    break;
  case C1:
    puVar2 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)1,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                       (context);
    instruction_local._4_4_ = (uint32_t)*puVar2;
    break;
  case C2:
    puVar2 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)2,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                       (context);
    instruction_local._4_4_ = (uint32_t)*puVar2;
    break;
  case C3:
    puVar2 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)3,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                       (context);
    instruction_local._4_4_ = (uint32_t)*puVar2;
    break;
  case AH:
    puVar2 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)4,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                       (context);
    instruction_local._4_4_ = (uint32_t)*puVar2;
    break;
  case C5:
    puVar2 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)5,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                       (context);
    instruction_local._4_4_ = (uint32_t)*puVar2;
    break;
  case C6:
    puVar2 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)6,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                       (context);
    instruction_local._4_4_ = (uint32_t)*puVar2;
    break;
  case BH:
    puVar2 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)7,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                       (context);
    instruction_local._4_4_ = (uint32_t)*puVar2;
    break;
  default:
    instruction_local._4_4_ = 0;
    break;
  case DirectAddress:
    instruction_local._4_4_ =
         address<(InstructionSet::x86::Source)15,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                   (instruction,instruction_local._2_2_,context);
    break;
  case IndirectNoBase:
    instruction_local._4_4_ =
         address<(InstructionSet::x86::Source)23,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                   (instruction,instruction_local._2_2_,context);
    break;
  case Indirect:
    instruction_local._4_4_ =
         address<(InstructionSet::x86::Source)24,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                   (instruction,instruction_local._2_2_,context);
  }
  return instruction_local._4_4_;
}

Assistant:

uint32_t address(
	InstructionT &instruction,
	DataPointer pointer,
	ContextT &context
) {
	// TODO: at least on the 8086 this isn't how register 'addresses' are resolved; instead whatever was the last computed address
	// remains in the address register and is returned. Find out what other x86s do and make a decision.
	switch(pointer.source()) {
		default:						return 0;
		case Source::eAX:				return *register_<IntT, access, Source::eAX>(context);
		case Source::eCX:				return *register_<IntT, access, Source::eCX>(context);
		case Source::eDX:				return *register_<IntT, access, Source::eDX>(context);
		case Source::eBX:				return *register_<IntT, access, Source::eBX>(context);
		case Source::eSPorAH:			return *register_<IntT, access, Source::eSPorAH>(context);
		case Source::eBPorCH:			return *register_<IntT, access, Source::eBPorCH>(context);
		case Source::eSIorDH:			return *register_<IntT, access, Source::eSIorDH>(context);
		case Source::eDIorBH:			return *register_<IntT, access, Source::eDIorBH>(context);
		case Source::Indirect:			return address<Source::Indirect, IntT, access>(instruction, pointer, context);
		case Source::IndirectNoBase:	return address<Source::IndirectNoBase, IntT, access>(instruction, pointer, context);
		case Source::DirectAddress:		return address<Source::DirectAddress, IntT, access>(instruction, pointer, context);
	}
}